

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderCreateShaderProgramvTest::initPipelineObject
          (GeometryShaderCreateShaderProgramvTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GeometryShaderCreateShaderProgramvTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6d8))(1,&this->m_pipeline_object_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenProgramPipelines() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xf0);
  (**(code **)(lVar4 + 0x1688))(this->m_pipeline_object_id,2,this->m_fs_po_id);
  (**(code **)(lVar4 + 0x1688))(this->m_pipeline_object_id,4,this->m_gs_po_id);
  (**(code **)(lVar4 + 0x1688))(this->m_pipeline_object_id,1,this->m_vs_po_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUseProgramStages() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xf6);
  return;
}

Assistant:

void GeometryShaderCreateShaderProgramvTest::initPipelineObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	DE_ASSERT(m_fs_po_id != 0 && m_gs_po_id != 0 && m_vs_po_id != 0);

	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_GEOMETRY_SHADER_BIT, m_gs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_VERTEX_SHADER_BIT, m_vs_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call(s) failed.");
}